

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::python::Generator::PrintImports(Generator *this)

{
  string *filename;
  int iVar1;
  FileDescriptor *pFVar2;
  char **ppcVar3;
  int i;
  ulong uVar4;
  int iVar5;
  long lVar6;
  string import_statement;
  string module_alias;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string module_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar5 = 0;
  do {
    if (*(int *)(this->file_ + 0x18) <= iVar5) {
      io::Printer::Print(this->printer_,"\n");
      for (iVar5 = 0; iVar5 < *(int *)(this->file_ + 0x38); iVar5 = iVar5 + 1) {
        pFVar2 = FileDescriptor::public_dependency(this->file_,iVar5);
        anon_unknown_0::ModuleName(&module_name,*(string **)pFVar2);
        io::Printer::Print(this->printer_,"from $module$ import *\n","module",&module_name);
        std::__cxx11::string::~string((string *)&module_name);
      }
      io::Printer::Print(this->printer_,"\n");
      return;
    }
    pFVar2 = FileDescriptor::dependency(this->file_,iVar5);
    filename = *(string **)pFVar2;
    anon_unknown_0::ModuleName(&module_name,filename);
    anon_unknown_0::ModuleAlias(&module_alias,filename);
    Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&import_statement,&module_name,".",true);
    uVar4 = 0xffffffffffffffff;
    lVar6 = 0;
    do {
      uVar4 = uVar4 + 1;
      if ((ulong)((long)(import_statement._M_string_length - (long)import_statement._M_dataplus._M_p
                        ) >> 5) <= uVar4) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&import_statement);
        iVar1 = std::__cxx11::string::rfind((char)&module_name,0x2e);
        import_statement._M_dataplus._M_p = (pointer)&import_statement.field_2;
        import_statement._M_string_length = 0;
        import_statement.field_2._M_local_buf[0] = '\0';
        if (iVar1 == -1) {
          std::operator+(&local_d0,"import ",&module_name);
          std::__cxx11::string::operator=((string *)&import_statement,(string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_90,(ulong)&module_name);
          std::operator+(&local_70,"from ",&local_90);
          std::operator+(&local_f0,&local_70," import ");
          std::__cxx11::string::substr((ulong)&local_50,(ulong)&module_name);
          std::operator+(&local_d0,&local_f0,&local_50);
          std::__cxx11::string::operator=((string *)&import_statement,(string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
        }
        io::Printer::Print(this->printer_,"$statement$ as $alias$\n","statement",&import_statement,
                           "alias",&module_alias);
        std::__cxx11::string::~string((string *)&import_statement);
        goto LAB_0026a7a0;
      }
      ppcVar3 = std::
                __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ((anonymous_namespace)::kKeywords,&ruby::Generator::vtable,
                           import_statement._M_dataplus._M_p + lVar6);
      lVar6 = lVar6 + 0x20;
    } while (ppcVar3 == (char **)&ruby::Generator::vtable);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&import_statement);
    io::Printer::Print(this->printer_,"import importlib\n");
    io::Printer::Print(this->printer_,"$alias$ = importlib.import_module(\'$name$\')\n","alias",
                       &module_alias,"name",&module_name);
LAB_0026a7a0:
    pFVar2 = FileDescriptor::dependency(this->file_,iVar5);
    CopyPublicDependenciesAliases(this,&module_alias,pFVar2);
    std::__cxx11::string::~string((string *)&module_alias);
    std::__cxx11::string::~string((string *)&module_name);
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void Generator::PrintImports() const {
  for (int i = 0; i < file_->dependency_count(); ++i) {
    const string& filename = file_->dependency(i)->name();

    string module_name = ModuleName(filename);
    string module_alias = ModuleAlias(filename);
    if (ContainsPythonKeyword(module_name)) {
      // If the module path contains a Python keyword, we have to quote the
      // module name and import it using importlib. Otherwise the usual kind of
      // import statement would result in a syntax error from the presence of
      // the keyword.
      printer_->Print("import importlib\n");
      printer_->Print("$alias$ = importlib.import_module('$name$')\n", "alias",
                      module_alias, "name", module_name);
    } else {
      int last_dot_pos = module_name.rfind('.');
      string import_statement;
      if (last_dot_pos == string::npos) {
        // NOTE(petya): this is not tested as it would require a protocol buffer
        // outside of any package, and I don't think that is easily achievable.
        import_statement = "import " + module_name;
      } else {
        import_statement = "from " + module_name.substr(0, last_dot_pos) +
                           " import " + module_name.substr(last_dot_pos + 1);
      }
      printer_->Print("$statement$ as $alias$\n", "statement", import_statement,
                      "alias", module_alias);
    }

    CopyPublicDependenciesAliases(module_alias, file_->dependency(i));
  }
  printer_->Print("\n");

  // Print public imports.
  for (int i = 0; i < file_->public_dependency_count(); ++i) {
    string module_name = ModuleName(file_->public_dependency(i)->name());
    printer_->Print("from $module$ import *\n", "module", module_name);
  }
  printer_->Print("\n");
}